

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::Config::Config(Config *this,ConfigData *data)

{
  pointer pbVar1;
  int iVar2;
  IStream *pIVar3;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar4;
  undefined4 extraout_var;
  iterator __end2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  pointer pbVar5;
  TestSpecParser parser;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> local_168;
  undefined1 local_150 [32];
  _Alloc_hider local_130;
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  _Alloc_hider local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  pointer local_d0;
  pointer puStack_c8;
  pointer local_c0;
  pointer psStack_b8;
  pointer local_b0;
  pointer psStack_a8;
  pointer local_a0;
  pointer pFStack_98;
  pointer local_90;
  pointer pbStack_88;
  pointer local_80;
  pointer pbStack_78;
  ITagAliasRegistry *local_70;
  TestSpec local_68;
  
  (this->super_IConfig).super_NonCopyable._vptr_NonCopyable = (_func_int **)&PTR__Config_0023ecc0;
  ConfigData::ConfigData(&this->m_data,data);
  local_150._0_8_ = (this->m_data).outputFilename._M_dataplus._M_p;
  local_150._8_8_ = (this->m_data).outputFilename._M_string_length;
  pIVar3 = makeStream((StringRef *)local_150);
  (this->m_stream)._M_t.
  super___uniq_ptr_impl<const_Catch::IStream,_std::default_delete<const_Catch::IStream>_>._M_t.
  super__Tuple_impl<0UL,_const_Catch::IStream_*,_std::default_delete<const_Catch::IStream>_>.
  super__Head_base<0UL,_const_Catch::IStream_*,_false>._M_head_impl = pIVar3;
  (this->m_testSpec).m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_testSpec).m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_testSpec).m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_testSpec).m_invalidArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_testSpec).m_invalidArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_testSpec).m_invalidArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_hasTestFilters = false;
  pbVar5 = (this->m_data).testsOrTags.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->m_data).testsOrTags.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar5 != pbVar1) {
    do {
      trim((string *)local_150,pbVar5);
      std::__cxx11::string::operator=((string *)pbVar5,(string *)local_150);
      if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
        operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != pbVar1);
  }
  pbVar5 = (this->m_data).sectionsToRun.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->m_data).sectionsToRun.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar5 != pbVar1) {
    do {
      trim((string *)local_150,pbVar5);
      std::__cxx11::string::operator=((string *)pbVar5,(string *)local_150);
      if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
        operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != pbVar1);
  }
  pSVar4 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  iVar2 = (*(pSVar4->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[4])(pSVar4);
  local_70 = (ITagAliasRegistry *)CONCAT44(extraout_var,iVar2);
  local_130._M_p = (pointer)&local_120;
  local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
  local_150._0_8_ = (char *)0x0;
  local_150._16_8_ = 0;
  local_150._24_8_ = 0;
  local_128 = 0;
  local_120._M_local_buf[0] = '\0';
  local_110._M_p = (pointer)&local_100;
  local_108 = 0;
  local_100._M_local_buf[0] = '\0';
  local_f0._M_p = (pointer)&local_e0;
  local_e8 = 0;
  local_e0._M_local_buf[0] = '\0';
  local_d0 = (pointer)0x0;
  puStack_c8 = (pointer)0x0;
  local_c0 = (pointer)0x0;
  psStack_b8 = (pointer)0x0;
  local_b0 = (pointer)0x0;
  psStack_a8 = (pointer)0x0;
  local_a0 = (pointer)0x0;
  pFStack_98 = (pointer)0x0;
  local_90 = (pointer)0x0;
  pbStack_88 = (pointer)0x0;
  local_80 = (pointer)0x0;
  pbStack_78 = (pointer)0x0;
  pbVar5 = (this->m_data).testsOrTags.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->m_data).testsOrTags.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar5 != pbVar1) {
    this->m_hasTestFilters = true;
    do {
      TestSpecParser::parse((TestSpecParser *)local_150,pbVar5);
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != pbVar1);
  }
  TestSpecParser::testSpec(&local_68,(TestSpecParser *)local_150);
  local_168.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->m_testSpec).m_filters.
       super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  (this->m_testSpec).m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_68.m_filters.
       super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  local_168.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (this->m_testSpec).m_filters.
       super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl
       .super__Vector_impl_data._M_start;
  local_168.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (this->m_testSpec).m_filters.
       super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl
       .super__Vector_impl_data._M_finish;
  (this->m_testSpec).m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_68.m_filters.
       super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl
       .super__Vector_impl_data._M_start;
  (this->m_testSpec).m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_68.m_filters.
       super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_68.m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  clara::std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            (&local_168);
  local_168.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(this->m_testSpec).m_invalidArgs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_testSpec).m_invalidArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_68.m_invalidArgs.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_168.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)(this->m_testSpec).m_invalidArgs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_168.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)(this->m_testSpec).m_invalidArgs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_testSpec).m_invalidArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_68.m_invalidArgs.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_testSpec).m_invalidArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_68.m_invalidArgs.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_68.m_invalidArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.m_invalidArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.m_invalidArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_168);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68.m_invalidArgs);
  clara::std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            (&local_68.m_filters);
  TestSpecParser::~TestSpecParser((TestSpecParser *)local_150);
  return;
}

Assistant:

Config::Config( ConfigData const& data )
    :   m_data( data ),
        m_stream( openStream() )
    {
        // We need to trim filter specs to avoid trouble with superfluous
        // whitespace (esp. important for bdd macros, as those are manually
        // aligned with whitespace).

        for (auto& elem : m_data.testsOrTags) {
            elem = trim(elem);
        }
        for (auto& elem : m_data.sectionsToRun) {
            elem = trim(elem);
        }

        TestSpecParser parser(ITagAliasRegistry::get());
        if (!m_data.testsOrTags.empty()) {
            m_hasTestFilters = true;
            for (auto const& testOrTags : m_data.testsOrTags) {
                parser.parse(testOrTags);
            }
        }
        m_testSpec = parser.testSpec();
    }